

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_png_to_func
              (stbi_write_func *func,void *context,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  int len;
  int local_1c;
  
  __ptr = stbi_write_png_to_mem((uchar *)data,stride_bytes,x,y,comp,&local_1c);
  if (__ptr != (uchar *)0x0) {
    (*func)(context,__ptr,local_1c);
    free(__ptr);
  }
  return (uint)(__ptr != (uchar *)0x0);
}

Assistant:

STBIWDEF int stbi_write_png_to_func(stbi_write_func *func, void *context, int x, int y, int comp, const void *data, int stride_bytes)
{
   int len;
   unsigned char *png = stbi_write_png_to_mem((const unsigned char *) data, stride_bytes, x, y, comp, &len);
   if (png == NULL) return 0;
   func(context, png, len);
   STBIW_FREE(png);
   return 1;
}